

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_dirread.c
# Opt level: O3

TIFFReadDirEntryErr TIFFReadDirEntryDoubleArray(TIFF *tif,TIFFDirEntry *direntry,double **value)

{
  short sVar1;
  ushort uVar2;
  uint uVar3;
  TIFFReadDirEntryErr TVar4;
  double *pdVar5;
  double *lp;
  double *pdVar6;
  ulong n;
  long lVar7;
  uint32_t uVar8;
  int iVar9;
  double dVar10;
  uint32_t count;
  void *origdata;
  uint local_4c;
  double *local_48;
  double **local_40;
  double *local_38;
  
  TVar4 = TIFFReadDirEntryErrType;
  if ((direntry->tdir_type < 0x12) &&
     (TVar4 = TIFFReadDirEntryErrType, (0x31f7aU >> (direntry->tdir_type & 0x1f) & 1) != 0)) {
    TVar4 = TIFFReadDirEntryArrayWithLimit(tif,direntry,&local_4c,8,&local_38,0xffffffffffffffff);
    if (local_38 == (double *)0x0 || TVar4 != TIFFReadDirEntryErrOk) {
      *value = (double *)0x0;
    }
    else {
      if (direntry->tdir_type == 0xc) {
        if ((tif->tif_flags & 0x80) != 0) {
          TIFFSwabArrayOfLong8((uint64_t *)local_38,(ulong)local_4c);
        }
        *value = local_38;
      }
      else {
        n = (ulong)local_4c;
        pdVar5 = (double *)_TIFFmallocExt(tif,n * 8);
        if (pdVar5 == (double *)0x0) {
          _TIFFfreeExt(tif,local_38);
          return TIFFReadDirEntryErrAlloc;
        }
        local_48 = local_38;
        local_40 = value;
        switch(direntry->tdir_type) {
        case 1:
          if (local_4c != 0) {
            lVar7 = 0;
            do {
              pdVar5[lVar7] = (double)*(byte *)((long)local_38 + lVar7);
              lVar7 = lVar7 + 1;
            } while (local_4c != (uint)lVar7);
          }
          break;
        case 3:
          if (local_4c != 0) {
            lVar7 = 0;
            pdVar6 = local_38;
            do {
              if ((tif->tif_flags & 0x80) != 0) {
                TIFFSwabShort((uint16_t *)pdVar6);
              }
              uVar2 = *(ushort *)pdVar6;
              pdVar6 = (double *)((long)pdVar6 + 2);
              pdVar5[lVar7] = (double)uVar2;
              lVar7 = lVar7 + 1;
            } while (local_4c != (uint)lVar7);
          }
          break;
        case 4:
          if (local_4c != 0) {
            lVar7 = 0;
            pdVar6 = local_38;
            do {
              if ((tif->tif_flags & 0x80) != 0) {
                TIFFSwabLong((uint32_t *)pdVar6);
              }
              uVar3 = *(uint *)pdVar6;
              pdVar6 = (double *)((long)pdVar6 + 4);
              pdVar5[lVar7] = (double)uVar3;
              lVar7 = lVar7 + 1;
            } while (local_4c != (uint)lVar7);
          }
          break;
        case 5:
          pdVar6 = pdVar5;
          lp = local_38;
          while (local_48 = local_38, local_4c != 0) {
            if ((tif->tif_flags & 0x80) == 0) {
              uVar8 = *(uint32_t *)lp;
            }
            else {
              TIFFSwabLong((uint32_t *)lp);
              uVar8 = *(uint32_t *)lp;
              if ((tif->tif_flags & 0x80) != 0) {
                TIFFSwabLong((uint32_t *)((long)lp + 4));
              }
            }
            dVar10 = 0.0;
            if (*(uint *)((long)lp + 4) != 0) {
              dVar10 = (double)uVar8 / (double)*(uint *)((long)lp + 4);
            }
            lp = lp + 1;
            *pdVar6 = dVar10;
            pdVar6 = pdVar6 + 1;
            local_4c = (int)n - 1;
            n = (ulong)local_4c;
            local_38 = local_48;
          }
          break;
        case 6:
          if (local_4c != 0) {
            lVar7 = 0;
            do {
              pdVar5[lVar7] = (double)(int)*(char *)((long)local_38 + lVar7);
              lVar7 = lVar7 + 1;
            } while (local_4c != (uint)lVar7);
          }
          break;
        case 8:
          if (local_4c != 0) {
            lVar7 = 0;
            pdVar6 = local_38;
            do {
              if ((tif->tif_flags & 0x80) != 0) {
                TIFFSwabShort((uint16_t *)pdVar6);
              }
              sVar1 = *(short *)pdVar6;
              pdVar6 = (double *)((long)pdVar6 + 2);
              pdVar5[lVar7] = (double)(int)sVar1;
              lVar7 = lVar7 + 1;
            } while (local_4c != (uint)lVar7);
          }
          break;
        case 9:
          if (local_4c != 0) {
            lVar7 = 0;
            pdVar6 = local_38;
            do {
              if ((tif->tif_flags & 0x80) != 0) {
                TIFFSwabLong((uint32_t *)pdVar6);
              }
              iVar9 = *(int *)pdVar6;
              pdVar6 = (double *)((long)pdVar6 + 4);
              pdVar5[lVar7] = (double)iVar9;
              lVar7 = lVar7 + 1;
            } while (local_4c != (uint)lVar7);
          }
          break;
        case 10:
          if (local_4c != 0) {
            lVar7 = 0;
            pdVar6 = local_38;
            do {
              if ((tif->tif_flags & 0x80) == 0) {
                iVar9 = *(int *)pdVar6;
              }
              else {
                TIFFSwabLong((uint32_t *)pdVar6);
                iVar9 = *(int *)pdVar6;
                if ((tif->tif_flags & 0x80) != 0) {
                  TIFFSwabLong((uint32_t *)((long)pdVar6 + 4));
                }
              }
              dVar10 = 0.0;
              if (*(uint *)((long)pdVar6 + 4) != 0) {
                dVar10 = (double)iVar9 / (double)*(uint *)((long)pdVar6 + 4);
              }
              pdVar6 = pdVar6 + 1;
              pdVar5[lVar7] = dVar10;
              lVar7 = lVar7 + 1;
              local_38 = local_48;
            } while (local_4c != (uint)lVar7);
          }
          break;
        case 0xb:
          if ((tif->tif_flags & 0x80) != 0) {
            TIFFSwabArrayOfLong((uint32_t *)local_38,n);
          }
          if (local_4c != 0) {
            lVar7 = 0;
            do {
              pdVar5[lVar7] = (double)*(float *)((long)local_38 + lVar7 * 4);
              lVar7 = lVar7 + 1;
            } while (local_4c != (uint)lVar7);
          }
          break;
        case 0x10:
          if (local_4c != 0) {
            lVar7 = 0;
            pdVar6 = local_38;
            do {
              if ((tif->tif_flags & 0x80) != 0) {
                TIFFSwabLong8((uint64_t *)pdVar6);
              }
              dVar10 = *pdVar6;
              pdVar6 = pdVar6 + 1;
              pdVar5[lVar7] =
                   ((double)CONCAT44(0x45300000,(int)((ulong)dVar10 >> 0x20)) -
                   1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,SUB84(dVar10,0)) - 4503599627370496.0);
              lVar7 = lVar7 + 1;
            } while (local_4c != (uint)lVar7);
          }
          break;
        case 0x11:
          if (local_4c != 0) {
            lVar7 = 0;
            pdVar6 = local_38;
            do {
              if ((tif->tif_flags & 0x80) != 0) {
                TIFFSwabLong8((uint64_t *)pdVar6);
              }
              dVar10 = *pdVar6;
              pdVar6 = pdVar6 + 1;
              pdVar5[lVar7] = (double)(long)dVar10;
              lVar7 = lVar7 + 1;
            } while (local_4c != (uint)lVar7);
          }
        }
        _TIFFfreeExt(tif,local_38);
        *local_40 = pdVar5;
      }
      TVar4 = TIFFReadDirEntryErrOk;
    }
  }
  return TVar4;
}

Assistant:

static enum TIFFReadDirEntryErr
TIFFReadDirEntryDoubleArray(TIFF *tif, TIFFDirEntry *direntry, double **value)
{
    enum TIFFReadDirEntryErr err;
    uint32_t count;
    void *origdata;
    double *data;
    switch (direntry->tdir_type)
    {
        case TIFF_BYTE:
        case TIFF_SBYTE:
        case TIFF_SHORT:
        case TIFF_SSHORT:
        case TIFF_LONG:
        case TIFF_SLONG:
        case TIFF_LONG8:
        case TIFF_SLONG8:
        case TIFF_RATIONAL:
        case TIFF_SRATIONAL:
        case TIFF_FLOAT:
        case TIFF_DOUBLE:
            break;
        default:
            return (TIFFReadDirEntryErrType);
    }
    err = TIFFReadDirEntryArray(tif, direntry, &count, 8, &origdata);
    if ((err != TIFFReadDirEntryErrOk) || (origdata == 0))
    {
        *value = 0;
        return (err);
    }
    switch (direntry->tdir_type)
    {
        case TIFF_DOUBLE:
            if (tif->tif_flags & TIFF_SWAB)
                TIFFSwabArrayOfLong8((uint64_t *)origdata, count);
            TIFFCvtIEEEDoubleToNative(tif, count, (double *)origdata);
            *value = (double *)origdata;
            return (TIFFReadDirEntryErrOk);
    }
    data = (double *)_TIFFmallocExt(tif, count * sizeof(double));
    if (data == 0)
    {
        _TIFFfreeExt(tif, origdata);
        return (TIFFReadDirEntryErrAlloc);
    }
    switch (direntry->tdir_type)
    {
        case TIFF_BYTE:
        {
            uint8_t *ma;
            double *mb;
            uint32_t n;
            ma = (uint8_t *)origdata;
            mb = data;
            for (n = 0; n < count; n++)
                *mb++ = (double)(*ma++);
        }
        break;
        case TIFF_SBYTE:
        {
            int8_t *ma;
            double *mb;
            uint32_t n;
            ma = (int8_t *)origdata;
            mb = data;
            for (n = 0; n < count; n++)
                *mb++ = (double)(*ma++);
        }
        break;
        case TIFF_SHORT:
        {
            uint16_t *ma;
            double *mb;
            uint32_t n;
            ma = (uint16_t *)origdata;
            mb = data;
            for (n = 0; n < count; n++)
            {
                if (tif->tif_flags & TIFF_SWAB)
                    TIFFSwabShort(ma);
                *mb++ = (double)(*ma++);
            }
        }
        break;
        case TIFF_SSHORT:
        {
            int16_t *ma;
            double *mb;
            uint32_t n;
            ma = (int16_t *)origdata;
            mb = data;
            for (n = 0; n < count; n++)
            {
                if (tif->tif_flags & TIFF_SWAB)
                    TIFFSwabShort((uint16_t *)ma);
                *mb++ = (double)(*ma++);
            }
        }
        break;
        case TIFF_LONG:
        {
            uint32_t *ma;
            double *mb;
            uint32_t n;
            ma = (uint32_t *)origdata;
            mb = data;
            for (n = 0; n < count; n++)
            {
                if (tif->tif_flags & TIFF_SWAB)
                    TIFFSwabLong(ma);
                *mb++ = (double)(*ma++);
            }
        }
        break;
        case TIFF_SLONG:
        {
            int32_t *ma;
            double *mb;
            uint32_t n;
            ma = (int32_t *)origdata;
            mb = data;
            for (n = 0; n < count; n++)
            {
                if (tif->tif_flags & TIFF_SWAB)
                    TIFFSwabLong((uint32_t *)ma);
                *mb++ = (double)(*ma++);
            }
        }
        break;
        case TIFF_LONG8:
        {
            uint64_t *ma;
            double *mb;
            uint32_t n;
            ma = (uint64_t *)origdata;
            mb = data;
            for (n = 0; n < count; n++)
            {
                if (tif->tif_flags & TIFF_SWAB)
                    TIFFSwabLong8(ma);
#if defined(__WIN32__) && (_MSC_VER < 1500)
                /*
                 * XXX: MSVC 6.0 does not support
                 * conversion of 64-bit integers into
                 * floating point values.
                 */
                *mb++ = _TIFFUInt64ToDouble(*ma++);
#else
                *mb++ = (double)(*ma++);
#endif
            }
        }
        break;
        case TIFF_SLONG8:
        {
            int64_t *ma;
            double *mb;
            uint32_t n;
            ma = (int64_t *)origdata;
            mb = data;
            for (n = 0; n < count; n++)
            {
                if (tif->tif_flags & TIFF_SWAB)
                    TIFFSwabLong8((uint64_t *)ma);
                *mb++ = (double)(*ma++);
            }
        }
        break;
        case TIFF_RATIONAL:
        {
            uint32_t *ma;
            uint32_t maa;
            uint32_t mab;
            double *mb;
            uint32_t n;
            ma = (uint32_t *)origdata;
            mb = data;
            for (n = 0; n < count; n++)
            {
                if (tif->tif_flags & TIFF_SWAB)
                    TIFFSwabLong(ma);
                maa = *ma++;
                if (tif->tif_flags & TIFF_SWAB)
                    TIFFSwabLong(ma);
                mab = *ma++;
                if (mab == 0)
                    *mb++ = 0.0;
                else
                    *mb++ = (double)maa / (double)mab;
            }
        }
        break;
        case TIFF_SRATIONAL:
        {
            uint32_t *ma;
            int32_t maa;
            uint32_t mab;
            double *mb;
            uint32_t n;
            ma = (uint32_t *)origdata;
            mb = data;
            for (n = 0; n < count; n++)
            {
                if (tif->tif_flags & TIFF_SWAB)
                    TIFFSwabLong(ma);
                maa = *(int32_t *)ma;
                ma++;
                if (tif->tif_flags & TIFF_SWAB)
                    TIFFSwabLong(ma);
                mab = *ma++;
                if (mab == 0)
                    *mb++ = 0.0;
                else
                    *mb++ = (double)maa / (double)mab;
            }
        }
        break;
        case TIFF_FLOAT:
        {
            float *ma;
            double *mb;
            uint32_t n;
            if (tif->tif_flags & TIFF_SWAB)
                TIFFSwabArrayOfLong((uint32_t *)origdata, count);
            TIFFCvtIEEEFloatToNative(tif, count, (float *)origdata);
            ma = (float *)origdata;
            mb = data;
            for (n = 0; n < count; n++)
                *mb++ = (double)(*ma++);
        }
        break;
    }
    _TIFFfreeExt(tif, origdata);
    *value = data;
    return (TIFFReadDirEntryErrOk);
}